

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::Constraint::setUpperBound(Constraint *this,VectorDynSize *upperBound)

{
  long lVar1;
  VectorDynSize *in_RSI;
  long in_RDI;
  bool bVar2;
  
  lVar1 = iDynTree::VectorDynSize::size();
  bVar2 = lVar1 == *(long *)(in_RDI + 8);
  if (bVar2) {
    iDynTree::VectorDynSize::operator=((VectorDynSize *)(in_RDI + 0x70),in_RSI);
    *(undefined1 *)(in_RDI + 0x91) = 1;
  }
  else {
    iDynTree::reportError
              ("Constraint","setUpperBound",
               "The upperBound dimension is not coherent with the constraint size.");
  }
  return bVar2;
}

Assistant:

bool Constraint::setUpperBound(const VectorDynSize &upperBound)
        {
            if (upperBound.size() != m_constraintSize) {
                reportError("Constraint", "setUpperBound", "The upperBound dimension is not coherent with the constraint size.");
                return false;
            }
            m_upperBound = upperBound;
            m_isUpperBounded = true;
            return true;
        }